

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  int *piVar1;
  int iVar2;
  ImGuiContextHook *pIVar3;
  undefined8 uVar4;
  ImGuiContextHook *__dest;
  int iVar5;
  long lVar6;
  int iVar7;
  
  if (*(long *)(hook + 8) != 0) {
    iVar7 = (ctx->Hooks).Size;
    iVar2 = (ctx->Hooks).Capacity;
    if (iVar7 == iVar2) {
      iVar7 = iVar7 + 1;
      if (iVar2 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar2 / 2 + iVar2;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar2 < iVar7) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiContextHook *)
                 (*GImAllocatorAllocFunc)((long)iVar7 * 0x18,GImAllocatorUserData);
        pIVar3 = (ctx->Hooks).Data;
        if (pIVar3 != (ImGuiContextHook *)0x0) {
          memcpy(__dest,pIVar3,(long)(ctx->Hooks).Size * 0x18);
          pIVar3 = (ctx->Hooks).Data;
          if ((pIVar3 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        (ctx->Hooks).Data = __dest;
        (ctx->Hooks).Capacity = iVar7;
      }
    }
    pIVar3 = (ctx->Hooks).Data;
    lVar6 = (long)(ctx->Hooks).Size;
    *(undefined8 *)(pIVar3 + lVar6 * 0x18 + 0x10) = *(undefined8 *)(hook + 0x10);
    uVar4 = *(undefined8 *)(hook + 8);
    pIVar3 = pIVar3 + lVar6 * 0x18;
    *(undefined8 *)pIVar3 = *(undefined8 *)hook;
    *(undefined8 *)(pIVar3 + 8) = uVar4;
    (ctx->Hooks).Size = (ctx->Hooks).Size + 1;
    return;
  }
  __assert_fail("hook->Callback != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0xd35,"void ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
}

Assistant:

void ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL);
    g.Hooks.push_back(*hook);
}